

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<bool,_8UL> * __thiscall
spirv_cross::SmallVector<bool,_8UL>::operator=
          (SmallVector<bool,_8UL> *this,SmallVector<bool,_8UL> *other)

{
  bool *pbVar1;
  size_t sVar2;
  bool *pbVar3;
  size_t sVar4;
  
  (this->super_VectorView<bool>).buffer_size = 0;
  pbVar3 = (other->super_VectorView<bool>).ptr;
  if ((AlignedBuffer<bool,_8UL> *)pbVar3 == &other->stack_storage) {
    reserve(this,(other->super_VectorView<bool>).buffer_size);
    pbVar3 = (other->super_VectorView<bool>).ptr;
    sVar2 = (other->super_VectorView<bool>).buffer_size;
    pbVar1 = (this->super_VectorView<bool>).ptr;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      pbVar1[sVar4] = pbVar3[sVar4];
    }
    (this->super_VectorView<bool>).buffer_size = sVar2;
    (other->super_VectorView<bool>).buffer_size = 0;
  }
  else {
    pbVar1 = (this->super_VectorView<bool>).ptr;
    if ((AlignedBuffer<bool,_8UL> *)pbVar1 != &this->stack_storage) {
      free(pbVar1);
      pbVar3 = (other->super_VectorView<bool>).ptr;
    }
    (this->super_VectorView<bool>).ptr = pbVar3;
    sVar2 = other->buffer_capacity;
    (this->super_VectorView<bool>).buffer_size = (other->super_VectorView<bool>).buffer_size;
    this->buffer_capacity = sVar2;
    (other->super_VectorView<bool>).ptr = (bool *)0x0;
    (other->super_VectorView<bool>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}